

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<slang::ast::EvalContext::Frame>::
emplaceRealloc<slang::ast::EvalContext::Frame>
          (SmallVectorBase<slang::ast::EvalContext::Frame> *this,pointer pos,Frame *args)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ulong uVar3;
  size_type sVar4;
  SubroutineSymbol *pSVar5;
  SourceLocation SVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  pointer pFVar10;
  long lVar11;
  SubroutineSymbol **ppSVar12;
  _Rb_tree_header *this_00;
  _Rb_tree_header *__x;
  ulong capacity;
  pointer pFVar13;
  long lVar14;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar3 = this->cap;
  if (capacity < uVar3 * 2) {
    capacity = uVar3 * 2;
  }
  if (0x7fffffffffffffff - uVar3 < uVar3) {
    capacity = 0x7fffffffffffffff;
  }
  lVar14 = (long)pos - (long)this->data_;
  pFVar10 = (pointer)detail::allocArray(capacity,0x50);
  __x = &(args->temporaries)._M_t._M_impl.super__Rb_tree_header;
  std::_Rb_tree_header::_Rb_tree_header((_Rb_tree_header *)((long)pFVar10 + lVar14 + 8),__x);
  pSVar5 = args->subroutine;
  SVar6 = args->callLocation;
  uVar7 = *(undefined8 *)((long)&(args->lookupLocation).scope + 4);
  *(undefined8 *)((long)pFVar10 + lVar14 + 0x3c) = *(undefined8 *)&(args->callLocation).field_0x4;
  *(undefined8 *)((long)pFVar10 + lVar14 + 0x44) = uVar7;
  *(SubroutineSymbol **)((long)pFVar10 + lVar14 + 0x30) = pSVar5;
  *(SourceLocation *)((long)pFVar10 + lVar14 + 0x38) = SVar6;
  pFVar13 = this->data_;
  sVar4 = this->len;
  if (pFVar13 + sVar4 == pos) {
    if (sVar4 != 0) {
      lVar11 = 0;
      do {
        __x = (_Rb_tree_header *)
              ((long)&(pFVar13->temporaries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color +
              lVar11);
        std::_Rb_tree_header::_Rb_tree_header
                  ((_Rb_tree_header *)
                   ((long)&(pFVar10->temporaries)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_color + lVar11),__x);
        puVar1 = (undefined8 *)((long)&pFVar13->subroutine + lVar11);
        uVar7 = *puVar1;
        uVar8 = puVar1[1];
        puVar1 = (undefined8 *)(&(pFVar13->callLocation).field_0x4 + lVar11);
        uVar9 = puVar1[1];
        puVar2 = (undefined8 *)(&(pFVar10->callLocation).field_0x4 + lVar11);
        *puVar2 = *puVar1;
        puVar2[1] = uVar9;
        puVar1 = (undefined8 *)((long)&pFVar10->subroutine + lVar11);
        *puVar1 = uVar7;
        puVar1[1] = uVar8;
        lVar11 = lVar11 + 0x50;
      } while (sVar4 * 0x50 != lVar11);
    }
  }
  else {
    if (pFVar13 != pos) {
      ppSVar12 = &pFVar10->subroutine;
      do {
        __x = &(pFVar13->temporaries)._M_t._M_impl.super__Rb_tree_header;
        std::_Rb_tree_header::_Rb_tree_header((_Rb_tree_header *)(ppSVar12 + -5),__x);
        pSVar5 = pFVar13->subroutine;
        SVar6 = pFVar13->callLocation;
        uVar7 = *(undefined8 *)((long)&(pFVar13->lookupLocation).scope + 4);
        *(undefined8 *)((long)ppSVar12 + 0xc) = *(undefined8 *)&(pFVar13->callLocation).field_0x4;
        *(undefined8 *)((long)ppSVar12 + 0x14) = uVar7;
        *ppSVar12 = pSVar5;
        *(SourceLocation *)(ppSVar12 + 1) = SVar6;
        pFVar13 = pFVar13 + 1;
        ppSVar12 = ppSVar12 + 10;
      } while (pFVar13 != pos);
    }
    sVar4 = this->len;
    pFVar13 = this->data_;
    if (pFVar13 + sVar4 != pos) {
      this_00 = (_Rb_tree_header *)((long)pFVar10 + lVar14 + 0x58);
      do {
        __x = &(pos->temporaries)._M_t._M_impl.super__Rb_tree_header;
        std::_Rb_tree_header::_Rb_tree_header(this_00,__x);
        pSVar5 = pos->subroutine;
        SVar6 = pos->callLocation;
        uVar7 = *(undefined8 *)((long)&(pos->lookupLocation).scope + 4);
        *(undefined8 *)((long)&this_00[1]._M_header._M_parent + 4) =
             *(undefined8 *)&(pos->callLocation).field_0x4;
        *(undefined8 *)((long)&this_00[1]._M_header._M_left + 4) = uVar7;
        *(SubroutineSymbol **)&this_00[1]._M_header = pSVar5;
        this_00[1]._M_header._M_parent = (_Base_ptr)SVar6;
        pos = pos + 1;
        this_00 = this_00 + 2;
      } while (pos != pFVar13 + sVar4);
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)__x);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pFVar10;
  return (pointer)((long)pFVar10 + lVar14);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}